

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Robot.cpp
# Opt level: O0

void __thiscall Robot::communicate(Robot *this)

{
  Serial *pSVar1;
  allocator local_d9;
  string local_d8;
  string local_b8;
  int local_94;
  duration<long,_std::ratio<1L,_1000L>_> local_90;
  allocator local_81;
  string local_80;
  string local_60;
  undefined1 local_30 [8];
  string result;
  Robot *this_local;
  
  result.field_2._8_8_ = this;
  std::__cxx11::string::string((string *)local_30);
  writeDuty(this);
  pSVar1 = this->mySerial;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_80,"\n",&local_81);
  serial::Serial::readline(&local_60,pSVar1,0x18,&local_80);
  std::__cxx11::string::operator=((string *)local_30,(string *)&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_80);
  std::allocator<char>::~allocator((allocator<char> *)&local_81);
  setCount(this,(string *)local_30);
  do {
    local_94 = 10;
    std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>
              ((duration<long,std::ratio<1l,1000l>> *)&local_90,&local_94);
    std::this_thread::sleep_for<long,std::ratio<1l,1000l>>(&local_90);
    writeDuty(this);
    pSVar1 = this->mySerial;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_d8,"\n",&local_d9);
    serial::Serial::readline(&local_b8,pSVar1,0x18,&local_d8);
    std::__cxx11::string::operator=((string *)local_30,(string *)&local_b8);
    std::__cxx11::string::~string((string *)&local_b8);
    std::__cxx11::string::~string((string *)&local_d8);
    std::allocator<char>::~allocator((allocator<char> *)&local_d9);
    setCount(this,(string *)local_30);
    calcSpeed(this);
    calcVelocityAndTheta(this);
    calcWorldVelocity(this);
    calcPosition(this);
  } while( true );
}

Assistant:

void Robot::communicate() {
    std::string result;
    this->writeDuty();
    result = this->mySerial->readline(24, "\n");
    this->setCount(result);
    while(true) {
        std::this_thread::sleep_for(std::chrono::milliseconds(10));
        this->writeDuty();
        result = this->mySerial->readline(24, "\n");
        this->setCount(result);
        this->calcSpeed();
        /*std::cout << this->robotInfo.wheelVelocity[0] << "\t" << this->robotInfo.wheelVelocity[1]
        << "\t" << this->robotInfo.wheelVelocity[2] << std::endl;*/
        this->calcVelocityAndTheta();
        this->calcWorldVelocity();
        this->calcPosition();
    }
}